

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunk_iterator.hpp
# Opt level: O2

void __thiscall
burst::buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
::increment(buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
            *this)

{
  int *in_R9;
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_50;
  istream_type *local_40;
  int local_38;
  undefined1 local_34;
  tuple<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long,_int_*> local_30;
  
  local_40 = (this->m_current)._M_stream;
  local_38 = (this->m_current)._M_value;
  local_34 = (this->m_current)._M_ok;
  local_50._M_stream = (this->m_end)._M_stream;
  local_50._M_value = (this->m_end)._M_value;
  local_50._M_ok = (this->m_end)._M_ok;
  copy_at_most_n<std::istream_iterator<int,char,std::char_traits<char>,long>,long,int*>
            (&local_30,(burst *)&local_40,&local_50,
             (istream_iterator<int,_char,_std::char_traits<char>,_long> *)this->m_chunk_size,
             (long)(this->m_chunk).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr,in_R9)
  ;
  *(ulong *)((long)&(this->m_current)._M_stream + 5) =
       CONCAT53(local_30.
                super__Tuple_impl<0UL,_std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long,_int_*>
                .
                super__Head_base<0UL,_std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_false>
                ._M_head_impl._8_5_,
                local_30.
                super__Tuple_impl<0UL,_std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long,_int_*>
                .
                super__Head_base<0UL,_std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_false>
                ._M_head_impl._M_stream._5_3_);
  (this->m_current)._M_stream =
       (istream_type *)
       CONCAT35(local_30.
                super__Tuple_impl<0UL,_std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long,_int_*>
                .
                super__Head_base<0UL,_std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_false>
                ._M_head_impl._M_stream._5_3_,
                local_30.
                super__Tuple_impl<0UL,_std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long,_int_*>
                .
                super__Head_base<0UL,_std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_false>
                ._M_head_impl._M_stream._0_5_);
  this->m_chunk_end =
       (buffer_value_type *)
       local_30.
       super__Tuple_impl<0UL,_std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long,_int_*>
       .super__Tuple_impl<1UL,_long,_int_*>.super__Tuple_impl<2UL,_int_*>.
       super__Head_base<2UL,_int_*,_false>._M_head_impl;
  return;
}

Assistant:

void increment ()
        {
            std::tie(m_current, std::ignore, m_chunk_end) =
                copy_at_most_n(m_current, m_end, m_chunk_size, m_chunk.get());
        }